

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O0

void Seg_ManComputeDelay(Gia_Man_t *pGia,int DelayInit,int nFanouts,int fTwo,int fVerbose)

{
  sat_solver *psVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Seg_Man_t *p_00;
  long lVar8;
  abctime aVar9;
  int *pVars;
  Gia_Obj_t *pObj_00;
  bool bVar10;
  abctime local_98;
  uint local_7c;
  uint local_78;
  int Count;
  int DelayStart;
  Seg_Man_t *p;
  uint local_60;
  int nConfs;
  int Delay;
  int status;
  int nVars;
  int iFirst;
  int iLut;
  int i;
  Vec_Int_t *vEdges2;
  abctime clk;
  Gia_Obj_t *pObj;
  int local_28;
  int fVeryVerbose;
  int nTimeOut;
  int nBTLimit;
  int fVerbose_local;
  int fTwo_local;
  int nFanouts_local;
  int DelayInit_local;
  Gia_Man_t *pGia_local;
  
  fVeryVerbose = 0;
  local_28 = 0;
  pObj._4_4_ = 0;
  nTimeOut = fVerbose;
  nBTLimit = fTwo;
  fVerbose_local = nFanouts;
  fTwo_local = DelayInit;
  _nFanouts_local = pGia;
  vEdges2 = (Vec_Int_t *)Abc_Clock();
  _iLut = (Vec_Int_t *)0x0;
  p_00 = Seg_ManAlloc(_nFanouts_local,fVerbose_local);
  if (fTwo_local == 0) {
    local_7c = p_00->DelayMax;
  }
  else {
    local_7c = fTwo_local;
  }
  if (nTimeOut != 0) {
    uVar2 = nBTLimit + 1;
    uVar7 = p_00->FirstVar;
    uVar3 = sat_solver_nvars(p_00->pSat);
    printf("Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n",
           (ulong)local_7c,(ulong)uVar2,(ulong)uVar7,(ulong)uVar3);
  }
  Seg_ManCreateCnf(p_00,nBTLimit,nTimeOut);
  sat_solver_set_resource_limits(p_00->pSat,(long)fVeryVerbose,0,0,0);
  psVar1 = p_00->pSat;
  if (local_28 == 0) {
    local_98 = 0;
  }
  else {
    lVar8 = (long)local_28;
    aVar9 = Abc_Clock();
    local_98 = lVar8 * 1000000 + aVar9;
  }
  sat_solver_set_runtime_limit(psVar1,local_98);
  sat_solver_set_random(p_00->pSat,1);
  psVar1 = p_00->pSat;
  pVars = Vec_IntArray(p_00->vPolars);
  iVar4 = Vec_IntSize(p_00->vPolars);
  sat_solver_set_polarity(psVar1,pVars,iVar4);
  local_60 = p_00->DelayMax;
  do {
    if ((int)local_60 < 0) {
LAB_009ee1b6:
      Gia_ManEdgeFromArray(p_00->pGia,_iLut);
      Vec_IntFreeP((Vec_Int_t **)&iLut);
      Seg_ManStop(p_00);
      return;
    }
    iFirst = 0;
    while( true ) {
      iVar4 = Vec_IntSize(p_00->pGia->vCos);
      bVar10 = false;
      if (iFirst < iVar4) {
        pObj_00 = Gia_ManCo(p_00->pGia,iFirst);
        clk = (abctime)Gia_ObjFanin0(pObj_00);
        bVar10 = (Gia_Obj_t *)clk != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar4 = Gia_ObjId(p_00->pGia,(Gia_Obj_t *)clk);
      iVar5 = Vec_IntEntry(p_00->vFirsts,iVar4);
      iVar4 = Vec_IntEntry(p_00->vNvars,iVar4);
      if ((int)local_60 < iVar4) {
        psVar1 = p_00->pSat;
        iVar4 = Abc_Var2Lit(iVar5 + local_60,1);
        iVar4 = sat_solver_push(psVar1,iVar4);
        if (iVar4 == 0) break;
      }
      iFirst = iFirst + 1;
    }
    iVar4 = Gia_ManCoNum(p_00->pGia);
    if (iFirst < iVar4) {
      printf("Proved UNSAT for delay %d.  ",(ulong)local_60);
      aVar9 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar9 - (long)vEdges2);
      goto LAB_009ee1b6;
    }
    if ((int)local_60 <= (int)local_7c) {
      iVar4 = sat_solver_nconflicts(p_00->pSat);
      iVar5 = sat_solver_solve_internal(p_00->pSat);
      iVar6 = sat_solver_nconflicts(p_00->pSat);
      if (iVar5 != 1) {
        if (nTimeOut != 0) {
          if (iVar5 == -1) {
            printf("Proved UNSAT for delay %d.  ",(ulong)local_60);
          }
          else {
            printf("Resource limit reached for delay %d.  ",(ulong)local_60);
          }
          aVar9 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar9 - (long)vEdges2);
        }
        goto LAB_009ee1b6;
      }
      if (nTimeOut != 0) {
        local_78 = 0;
        for (iFirst = 0; iFirst < p_00->nVars; iFirst = iFirst + 1) {
          iVar5 = sat_solver_var_value(p_00->pSat,iFirst);
          local_78 = iVar5 + local_78;
        }
        printf("Solution with delay %2d and %5d edges exists. Conf = %8d.  ",(ulong)local_60,
               (ulong)local_78,(ulong)(uint)(iVar6 - iVar4));
        aVar9 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar9 - (long)vEdges2);
      }
      Vec_IntFreeP((Vec_Int_t **)&iLut);
      _iLut = Seg_ManConvertResult(p_00);
      if (pObj._4_4_ != 0) {
        for (iFirst = 0; iFirst < p_00->nVars; iFirst = iFirst + 1) {
          uVar7 = sat_solver_var_value(p_00->pSat,iFirst);
          printf("%d=%d ",(ulong)(uint)iFirst,(ulong)uVar7);
        }
        printf("   ");
        for (iFirst = p_00->nVars; iVar4 = sat_solver_nvars(p_00->pSat), iFirst < iVar4;
            iFirst = iFirst + 1) {
          uVar7 = sat_solver_var_value(p_00->pSat,iFirst);
          printf("%d=%d ",(ulong)(uint)iFirst,(ulong)uVar7);
        }
        printf("\n");
      }
    }
    local_60 = local_60 - 1;
  } while( true );
}

Assistant:

void Seg_ManComputeDelay( Gia_Man_t * pGia, int DelayInit, int nFanouts, int fTwo, int fVerbose )
{
    int nBTLimit = 0;
    int nTimeOut = 0;
    int fVeryVerbose = 0;

    Gia_Obj_t * pObj;
    abctime clk = Abc_Clock();
    Vec_Int_t * vEdges2 = NULL;
    int i, iLut, iFirst, nVars, status, Delay, nConfs;
    Seg_Man_t * p = Seg_ManAlloc( pGia, nFanouts );
    int DelayStart = DelayInit ? DelayInit : p->DelayMax;

    if ( fVerbose )
    printf( "Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n", 
        DelayStart, fTwo+1, p->FirstVar, sat_solver_nvars(p->pSat) );
    Seg_ManCreateCnf( p, fTwo, fVerbose );
    //Sat_SolverWriteDimacs( p->pSat, "test_edge.cnf", NULL, NULL, 0 );
    // set resource limits
    sat_solver_set_resource_limits( p->pSat, nBTLimit, 0, 0, 0 );
    sat_solver_set_runtime_limit( p->pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    sat_solver_set_random( p->pSat, 1 );
    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolars), Vec_IntSize(p->vPolars) );
    //sat_solver_set_var_activity( p->pSat, NULL, p->nVars );
    // increment delay gradually
    for ( Delay = p->DelayMax; Delay >= 0; Delay-- )
    {
        // we constrain COs, although it would be fine to constrain only POs
        Gia_ManForEachCoDriver( p->pGia, pObj, i )
        {
            iLut   = Gia_ObjId( p->pGia, pObj );
            iFirst = Vec_IntEntry( p->vFirsts, iLut );
            nVars  = Vec_IntEntry( p->vNvars, iLut );
            if ( Delay < nVars && !sat_solver_push(p->pSat, Abc_Var2Lit(iFirst + Delay, 1)) )
                break;
        }
        if ( i < Gia_ManCoNum(p->pGia) )
        {
            printf( "Proved UNSAT for delay %d.  ", Delay );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            break;
        }
        if ( Delay > DelayStart )
            continue;
        // solve with assumptions
        //clk = Abc_Clock();
        nConfs = sat_solver_nconflicts( p->pSat );
        status = sat_solver_solve_internal( p->pSat );
        nConfs = sat_solver_nconflicts( p->pSat ) - nConfs;
        if ( status == l_True )
        {
            if ( fVerbose )
            {
                int Count = 0;
                for ( i = 0; i < p->nVars; i++ )
                    Count += sat_solver_var_value(p->pSat, i);
                printf( "Solution with delay %2d and %5d edges exists. Conf = %8d.  ", Delay, Count, nConfs );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            // save the result
            Vec_IntFreeP( &vEdges2 );
            vEdges2 = Seg_ManConvertResult( p );
            if ( fVeryVerbose )
            {
                for ( i = 0; i < p->nVars; i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "   " );

                for ( i = p->nVars; i < sat_solver_nvars(p->pSat); i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
            }
        }
        else
        {
            if ( fVerbose )
            {
                if ( status == l_False )
                    printf( "Proved UNSAT for delay %d.  ", Delay );
                else
                    printf( "Resource limit reached for delay %d.  ", Delay );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            break;
        }
    }
    Gia_ManEdgeFromArray( p->pGia, vEdges2 );
    Vec_IntFreeP( &vEdges2 );
    Seg_ManStop( p );
}